

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<double,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double **transitionMatrices,int count)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  ulong uVar21;
  int iVar22;
  double *pdVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong local_98;
  
  if (0 < count) {
    local_98 = 0;
    auVar31 = ZEXT864(0) << 0x40;
    do {
      if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
        pdVar6 = transitionMatrices[probabilityIndices[local_98]];
        dVar1 = edgeLengths[local_98];
        lVar11 = 0;
        iVar22 = 0;
        do {
          iVar13 = eigenIndices[lVar11];
          pdVar23 = this->gEMatrices[iVar13];
          uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
          lVar9 = (long)(int)uVar8;
          if (0 < lVar9) {
            pdVar16 = this->gIMatrices[iVar13];
            pdVar20 = (this->super_EigenDecomposition<double,_1>).gEigenValues[iVar13];
            iVar13 = 0;
            do {
              if (this->isComplex == true) {
                dVar25 = pdVar20[lVar9 + iVar13];
                if ((dVar25 == 0.0) && (!NAN(dVar25))) goto LAB_0012d1f5;
                iVar14 = iVar13 + 1;
                dVar26 = exp(dVar1 * pdVar20[iVar13]);
                dVar27 = cos(dVar1 * dVar25);
                dVar25 = sin(dVar1 * dVar25);
                iVar5 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                if (0 < (long)iVar5) {
                  pdVar7 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  auVar24._8_8_ = 0x8000000000000000;
                  auVar24._0_8_ = 0x8000000000000000;
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = dVar26 * dVar25;
                  auVar24 = vxorpd_avx512vl(auVar28,auVar24);
                  lVar15 = (long)(iVar5 * iVar14);
                  lVar18 = (long)(iVar13 * iVar5);
                  lVar19 = 0;
                  do {
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar16[lVar18 + lVar19];
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = dVar26 * dVar27;
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = dVar26 * dVar25 * pdVar16[lVar15 + lVar19];
                    auVar28 = vfmadd231sd_fma(auVar32,auVar29,auVar2);
                    pdVar7[lVar18 + lVar19] = auVar28._0_8_;
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = pdVar16[lVar15 + lVar19];
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = auVar24._0_8_ * pdVar16[lVar18 + lVar19];
                    auVar28 = vfmadd231sd_fma(auVar33,auVar29,auVar3);
                    pdVar7[lVar15 + lVar19] = auVar28._0_8_;
                    lVar19 = lVar19 + 1;
                  } while (iVar5 != lVar19);
                }
              }
              else {
LAB_0012d1f5:
                dVar25 = exp(dVar1 * pdVar20[iVar13]);
                iVar5 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                iVar14 = iVar13;
                if (0 < (long)iVar5) {
                  pdVar7 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  lVar15 = 0;
                  do {
                    pdVar7[iVar5 * iVar13 + lVar15] = dVar25 * pdVar16[iVar5 * iVar13 + lVar15];
                    lVar15 = lVar15 + 1;
                  } while (iVar5 != lVar15);
                }
              }
              auVar31 = ZEXT864(0) << 0x40;
              iVar13 = iVar14 + 1;
              uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
            } while (iVar13 < (int)uVar8);
          }
          if (0 < (int)uVar8) {
            uVar10 = (ulong)uVar8;
            uVar12 = 0;
            do {
              pdVar16 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
              uVar17 = 0;
              lVar9 = (long)iVar22;
              do {
                lVar15 = lVar9;
                auVar24 = ZEXT816(0) << 0x40;
                uVar21 = 0;
                pdVar20 = pdVar16;
                do {
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = pdVar23[uVar21];
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = *pdVar20;
                  auVar24 = vfmadd231sd_fma(auVar24,auVar30,auVar4);
                  uVar21 = uVar21 + 1;
                  pdVar20 = pdVar20 + uVar10;
                } while (uVar10 != uVar21);
                auVar24 = vmaxsd_avx(auVar24,auVar31._0_16_);
                pdVar6[lVar15] = auVar24._0_8_;
                uVar17 = uVar17 + 1;
                pdVar16 = pdVar16 + 1;
                lVar9 = lVar15 + 1;
              } while (uVar17 != uVar10);
              pdVar6[(int)(lVar15 + 1)] = 1.0;
              iVar22 = (int)lVar15 + 2;
              uVar12 = uVar12 + 1;
              pdVar23 = pdVar23 + uVar10;
            } while (uVar12 != uVar10);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
      }
      local_98 = local_98 + 1;
    } while (local_98 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}